

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O2

aom_codec_err_t ctrl_set_postencode_drop_rtc(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  AV1_COMP *pAVar2;
  uint *puVar3;
  
  pAVar2 = ctx->ppi->cpi;
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar3 = (uint *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    puVar3 = (uint *)args->overflow_arg_area;
    args->overflow_arg_area = puVar3 + 2;
  }
  if (1 < *puVar3) {
    return AOM_CODEC_INVALID_PARAM;
  }
  (pAVar2->rc).postencode_drop = *puVar3;
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t ctrl_set_postencode_drop_rtc(aom_codec_alg_priv_t *ctx,
                                                    va_list args) {
  AV1_PRIMARY *const ppi = ctx->ppi;
  AV1_COMP *const cpi = ppi->cpi;
  int enable_postencode_drop = CAST(AV1E_SET_POSTENCODE_DROP_RTC, args);
  if (enable_postencode_drop > 1 || enable_postencode_drop < 0)
    return AOM_CODEC_INVALID_PARAM;
  cpi->rc.postencode_drop = enable_postencode_drop;
  return AOM_CODEC_OK;
}